

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.hpp
# Opt level: O1

bool doctest::detail::parseOptionImpl(int argc,char **argv,char *pattern,String *res)

{
  char *pcVar1;
  char cVar2;
  bool bVar3;
  long lVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  long lVar8;
  EVP_PKEY_CTX *src;
  bool bVar9;
  ulong uVar10;
  void *local_38;
  
  bVar9 = 0 < argc;
  if (0 < argc) {
    uVar10 = (ulong)(uint)argc;
    do {
      pcVar7 = argv[uVar10 - 1];
      pcVar5 = strstr(pcVar7,pattern);
      pcVar6 = pcVar7;
      if (pcVar5 != (char *)0x0) {
        do {
          if (pcVar6 == pcVar5) {
            if (*pcVar7 == '-') {
              pcVar7 = pattern;
              pcVar6 = pattern + -1;
              if (pattern != (char *)0x0) {
                do {
                  pcVar7 = pcVar6 + 1;
                  pcVar1 = pcVar6 + 1;
                  pcVar6 = pcVar7;
                } while (*pcVar1 != '\0');
              }
              lVar8 = -1;
              do {
                lVar4 = lVar8 + 1;
                lVar8 = lVar8 + 1;
              } while ((pcVar5 + ((long)pcVar7 - (long)pattern))[lVar4] != '\0');
              if ((int)lVar8 != 0) {
                String::String((String *)&local_38,pcVar5 + ((long)pcVar7 - (long)pattern));
                String::copy(res,(EVP_PKEY_CTX *)&local_38,src);
                free(local_38);
                return bVar9;
              }
            }
            break;
          }
          cVar2 = *pcVar6;
          pcVar6 = pcVar6 + 1;
        } while (cVar2 == '-');
      }
      bVar9 = 1 < (long)uVar10;
      bVar3 = 1 < (long)uVar10;
      uVar10 = uVar10 - 1;
    } while (bVar3);
  }
  return bVar9;
}

Assistant:

bool parseOptionImpl(int argc, const char* const* argv, const char* pattern, String& res) {
        for(int i = argc - 1; i >= 0; --i) {
            const char* temp = strstr(argv[i], pattern);
            if(temp) {
                // eliminate matches in which the chars before the option are not '-'
                bool        noBadCharsFound = true;
                const char* curr            = argv[i];
                while(curr != temp) {
                    if(*curr++ != '-') {
                        noBadCharsFound = false;
                        break;
                    }
                }
                if(noBadCharsFound && argv[i][0] == '-') {
                    temp += my_strlen(pattern);
                    unsigned len = my_strlen(temp);
                    if(len) {
                        res = temp;
                        return true;
                    }
                }
            }
        }
        return false;
    }